

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull_by_size.c
# Opt level: O1

int pull_by_size(char *input_file,int min,int max,int length,int convert,int just_count)

{
  kstring_t *str;
  size_t sVar1;
  int iVar2;
  gzFile pgVar3;
  kseq_t *seq;
  kstream_t *pkVar4;
  uchar *puVar5;
  uint extraout_var;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  size_t __size;
  uint uStackY_7c;
  ulong uStackY_78;
  
  pgVar3 = (gzFile)gzopen();
  if (pgVar3 != (gzFile)0x0) {
    seq = (kseq_t *)calloc(1,0x70);
    pkVar4 = (kstream_t *)calloc(1,0x20);
    pkVar4->f = pgVar3;
    puVar5 = (uchar *)malloc(0xffff);
    pkVar4->buf = puVar5;
    seq->f = pkVar4;
    kseq_read(seq);
    pcVar6 = (seq->qual).s;
    gzrewind(pgVar3);
    pkVar4 = seq->f;
    pkVar4->begin = 0;
    pkVar4->end = 0;
    pkVar4->is_eof = 0;
    seq->last_char = 0;
    if (verbose_flag != 0) {
      pull_by_size_cold_1();
    }
    iVar2 = kseq_read(seq);
    uVar8 = 0;
    uVar9 = 0;
    if (-1 < iVar2) {
      uVar8 = 0;
      uVar9 = 0;
      do {
        iVar2 = size_filter(seq,(uint)(pcVar6 == (char *)0x0),min,max,length,convert,just_count);
        uVar9 = uVar9 + (iVar2 == 0);
        uVar8 = uVar8 + (iVar2 != 0);
        iVar2 = kseq_read(seq);
      } while (-1 < iVar2);
    }
    if (seq != (kseq_t *)0x0) {
      free((seq->name).s);
      free((seq->comment).s);
      free((seq->seq).s);
      free((seq->qual).s);
      pkVar4 = seq->f;
      if (pkVar4 != (kstream_t *)0x0) {
        free(pkVar4->buf);
        free(pkVar4);
      }
      free(seq);
    }
    gzclose(pgVar3);
    if (just_count != 0) {
      fprintf(_stdout,"Total output: %i\n",(ulong)uVar8);
      fprintf(_stdout,"Total excluded: %i\n",(ulong)uVar9);
    }
    return uVar8;
  }
  pull_by_size_cold_2();
  pkVar4 = (kstream_t *)((kstring_t *)((long)input_file + 0x60))->m;
  uStackY_78 = (ulong)(uint)length;
  uStackY_7c = extraout_var;
  if ((int)((kstring_t *)((long)input_file + 0x60))->l == 0) {
    do {
      if ((pkVar4->is_eof == 0) || (uVar8 = 0xffffffff, pkVar4->begin < pkVar4->end)) {
        if (pkVar4->end <= pkVar4->begin) {
          pkVar4->begin = 0;
          iVar2 = gzread(pkVar4->f,pkVar4->buf,0xffff);
          pkVar4->end = iVar2;
          if (iVar2 == 0) {
            pkVar4->is_eof = 1;
            uVar8 = 0xffffffff;
            goto LAB_00105395;
          }
        }
        iVar2 = pkVar4->begin;
        pkVar4->begin = iVar2 + 1;
        uVar8 = (uint)pkVar4->buf[iVar2];
      }
LAB_00105395:
      if (uVar8 == 0xffffffff) {
        return -1;
      }
      uStackY_7c = uVar8;
    } while ((uVar8 != 0x40) && (uVar8 != 0x3e));
    *(uint *)&((kstring_t *)((long)input_file + 0x60))->l = uVar8;
  }
  ((kstring_t *)((long)input_file + 0x48))->l = 0;
  ((kstring_t *)((long)input_file + 0x30))->l = 0;
  ((kstring_t *)((long)input_file + 0x18))->l = 0;
  iVar2 = ks_getuntil2(pkVar4,0,(kstring_t *)input_file,(int *)&uStackY_7c,0);
  if (iVar2 < 0) {
    iVar2 = -1;
  }
  else {
    if (uStackY_7c != 10) {
      ks_getuntil2(pkVar4,2,(kstring_t *)((long)input_file + 0x18),(int *)0x0,0);
    }
    if (((kstring_t *)((long)input_file + 0x30))->s == (char *)0x0) {
      ((kstring_t *)((long)input_file + 0x30))->m = 0x100;
      pcVar6 = (char *)malloc(0x100);
      ((kstring_t *)((long)input_file + 0x30))->s = pcVar6;
    }
    str = (kstring_t *)((long)input_file + 0x30);
LAB_00105413:
    if ((pkVar4->is_eof == 0) || (uVar8 = 0xffffffff, pkVar4->begin < pkVar4->end)) {
      if (pkVar4->end <= pkVar4->begin) {
        pkVar4->begin = 0;
        iVar2 = gzread(pkVar4->f,pkVar4->buf,0xffff);
        pkVar4->end = iVar2;
        if (iVar2 == 0) {
          pkVar4->is_eof = 1;
          uVar8 = 0xffffffff;
          goto LAB_00105466;
        }
      }
      iVar2 = pkVar4->begin;
      pkVar4->begin = iVar2 + 1;
      uVar8 = (uint)pkVar4->buf[iVar2];
    }
LAB_00105466:
    uStackY_7c = uVar8;
    if ((int)uVar8 < 0x2b) goto code_r0x0010546f;
    if (uVar8 != 0x2b) {
      if ((uVar8 != 0x3e) && (uVar8 != 0x40)) goto LAB_0010548a;
      *(uint *)&((kstring_t *)((long)input_file + 0x60))->l = uVar8;
    }
LAB_001054d6:
    uVar7 = ((kstring_t *)((long)input_file + 0x30))->l + 1;
    if (((kstring_t *)((long)input_file + 0x30))->m <= uVar7) {
      uVar7 = uVar7 >> 1 | uVar7;
      uVar7 = uVar7 >> 2 | uVar7;
      uVar7 = uVar7 >> 4 | uVar7;
      uVar7 = uVar7 >> 8 | uVar7;
      __size = (uVar7 >> 0x10 | uVar7) + 1;
      ((kstring_t *)((long)input_file + 0x30))->m = __size;
      pcVar6 = (char *)realloc(((kstring_t *)((long)input_file + 0x30))->s,__size);
      ((kstring_t *)((long)input_file + 0x30))->s = pcVar6;
    }
    ((kstring_t *)((long)input_file + 0x30))->s[((kstring_t *)((long)input_file + 0x30))->l] = '\0';
    if (uStackY_7c == 0x2b) {
      uVar7 = ((kstring_t *)((long)input_file + 0x30))->m;
      if (((kstring_t *)((long)input_file + 0x48))->m < uVar7) {
        ((kstring_t *)((long)input_file + 0x48))->m = uVar7;
        pcVar6 = (char *)realloc(((kstring_t *)((long)input_file + 0x48))->s,uVar7);
        ((kstring_t *)((long)input_file + 0x48))->s = pcVar6;
      }
      do {
        if ((pkVar4->is_eof == 0) || (uVar8 = 0xffffffff, pkVar4->begin < pkVar4->end)) {
          if (pkVar4->end <= pkVar4->begin) {
            pkVar4->begin = 0;
            iVar2 = gzread(pkVar4->f,pkVar4->buf,0xffff);
            pkVar4->end = iVar2;
            if (iVar2 == 0) {
              pkVar4->is_eof = 1;
              uVar8 = 0xffffffff;
              goto LAB_001055be;
            }
          }
          iVar2 = pkVar4->begin;
          pkVar4->begin = iVar2 + 1;
          uVar8 = (uint)pkVar4->buf[iVar2];
        }
LAB_001055be:
        if (uVar8 == 0xffffffff) {
          return -2;
        }
        uStackY_7c = uVar8;
      } while (uVar8 != 10);
      uStackY_7c = 10;
      do {
        iVar2 = ks_getuntil2(pkVar4,2,(kstring_t *)((long)input_file + 0x48),(int *)0x0,1);
        if (iVar2 < 0) break;
      } while (((kstring_t *)((long)input_file + 0x48))->l < str->l);
      *(undefined4 *)&((kstring_t *)((long)input_file + 0x60))->l = 0;
      iVar2 = -2;
      if (((kstring_t *)((long)input_file + 0x30))->l == ((kstring_t *)((long)input_file + 0x48))->l
         ) {
        iVar2 = (int)((kstring_t *)((long)input_file + 0x30))->l;
      }
    }
    else {
      iVar2 = (int)str->l;
    }
  }
  return iVar2;
code_r0x0010546f:
  if (uVar8 != 10) {
    if (uVar8 == 0xffffffff) goto LAB_001054d6;
LAB_0010548a:
    sVar1 = ((kstring_t *)((long)input_file + 0x30))->l;
    ((kstring_t *)((long)input_file + 0x30))->l = sVar1 + 1;
    ((kstring_t *)((long)input_file + 0x30))->s[sVar1] = (char)uVar8;
    ks_getuntil2(pkVar4,2,str,(int *)0x0,1);
  }
  goto LAB_00105413;
}

Assistant:

__KSEQ_READ(static)

/*
extern char const *progname;
extern int verbose_flag;
*/

int pull_by_size(char *input_file, int min, int max,int length, int convert, int just_count) {
	gzFile fp;
	int count=0,l;
	int hit = 0;
	int excluded = 0;
	int is_fasta = 0; /* assume fastq */
	kseq_t *seq;

	/* open fasta file */
	fp = gzopen(input_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,input_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp);

	/* determine file type */
	l = kseq_read(seq); /* read the first sequence */
	is_fasta = seq->qual.s == NULL ? 1 : 0;
	gzrewind(fp); 
	kseq_rewind(seq); /* rewind to beginning for main loop */

    if (verbose_flag) {
        if (is_fasta)
            fprintf(stderr, "Input is FASTA format\n");
        else
            fprintf(stderr, "Input is FASTQ format\n");
    }

	/* search through list and see if this header matches */
	while((l = kseq_read(seq)) >= 0) {
		hit = size_filter(seq, is_fasta, min, max, length, convert, just_count);
		if (hit)
			count++;
		else
			excluded++;
	}
	kseq_destroy(seq);
	gzclose(fp); /* done reading file */

	if (just_count) {
		fprintf(stdout, "Total output: %i\n", count);
		fprintf(stdout, "Total excluded: %i\n", excluded);
	}
	return count;
}